

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Window_clear(HTS_Window *win)

{
  HTS_Window *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI->coefficient != (double **)0x0) {
    for (local_10 = 0; local_10 < in_RDI->size; local_10 = local_10 + 1) {
      in_RDI->coefficient[local_10] = in_RDI->coefficient[local_10] + in_RDI->l_width[local_10];
      HTS_free((void *)0x2126a5);
    }
    HTS_free((void *)0x2126c3);
  }
  if (in_RDI->l_width != (int *)0x0) {
    HTS_free((void *)0x2126dd);
  }
  if (in_RDI->r_width != (int *)0x0) {
    HTS_free((void *)0x2126f7);
  }
  HTS_Window_initialize(in_RDI);
  return;
}

Assistant:

static void HTS_Window_clear(HTS_Window * win)
{
   size_t i;

   if (win->coefficient != NULL) {
      for (i = 0; i < win->size; i++) {
         win->coefficient[i] += win->l_width[i];
         HTS_free(win->coefficient[i]);
      }
      HTS_free(win->coefficient);
   }
   if (win->l_width)
      HTS_free(win->l_width);
   if (win->r_width)
      HTS_free(win->r_width);

   HTS_Window_initialize(win);
}